

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O0

string * __thiscall
cmLocalNinjaGenerator::CreateUtilityOutput
          (string *__return_storage_ptr__,cmLocalNinjaGenerator *this,string *targetName,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *byproducts,cmListFileBacktrace *bt)

{
  bool bVar1;
  uint uVar2;
  cmGlobalGenerator *pcVar3;
  string *str;
  cmSourceFile *this_00;
  cmGlobalNinjaGenerator *this_01;
  string_view view;
  cmAlphaNum local_230;
  cmAlphaNum local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  allocator<char> local_1a9;
  string local_1a8;
  cmSourceFile *local_188;
  cmSourceFile *sf;
  cmAlphaNum local_150;
  undefined1 local_120 [8];
  string force;
  string *config;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  cmAlphaNum local_b0;
  cmAlphaNum local_80;
  undefined1 local_50 [8];
  string base;
  cmListFileBacktrace *bt_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *byproducts_local;
  string *targetName_local;
  cmLocalNinjaGenerator *this_local;
  
  base.field_2._8_8_ = bt;
  pcVar3 = cmLocalGenerator::GetGlobalGenerator((cmLocalGenerator *)this);
  uVar2 = (*pcVar3->_vptr_cmGlobalGenerator[0x26])();
  if (((uVar2 & 1) == 0) ||
     (bVar1 = HasUniqueByproducts(this,byproducts,(cmListFileBacktrace *)base.field_2._8_8_), !bVar1
     )) {
    cmLocalGenerator::CreateUtilityOutput
              (__return_storage_ptr__,(cmLocalGenerator *)this,targetName,byproducts,
               (cmListFileBacktrace *)base.field_2._8_8_);
  }
  else {
    str = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
    cmAlphaNum::cmAlphaNum(&local_80,str);
    cmAlphaNum::cmAlphaNum(&local_b0,"/CMakeFiles/");
    __range1._7_1_ = 0x2d;
    cmStrCat<std::__cxx11::string,char>
              ((string *)local_50,&local_80,&local_b0,targetName,(char *)((long)&__range1 + 7));
    cmMakefile::GetGeneratorConfigs_abi_cxx11_
              (&local_d8,(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile,
               IncludeEmptyConfig);
    local_c0 = &local_d8;
    __end1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(local_c0);
    config = (string *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(local_c0);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&config), bVar1) {
      force.field_2._8_8_ =
           __gnu_cxx::
           __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(&__end1);
      cmAlphaNum::cmAlphaNum(&local_150,(string *)local_50);
      cmAlphaNum::cmAlphaNum((cmAlphaNum *)&sf,(string *)force.field_2._8_8_);
      cmStrCat<>((string *)local_120,&local_150,(cmAlphaNum *)&sf);
      this_00 = cmMakefile::GetOrCreateGeneratedSource
                          ((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile,
                           (string *)local_120);
      local_188 = this_00;
      if (this_00 == (cmSourceFile *)0x0) {
        std::operator+(&local_1d0,"Could not get source file entry for ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_120);
        cmSystemTools::Error(&local_1d0);
        std::__cxx11::string::~string((string *)&local_1d0);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1a8,"SYMBOLIC",&local_1a9);
        cmSourceFile::SetProperty(this_00,&local_1a8,"1");
        std::__cxx11::string::~string((string *)&local_1a8);
        std::allocator<char>::~allocator(&local_1a9);
      }
      std::__cxx11::string::~string((string *)local_120);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_d8);
    this_01 = GetGlobalNinjaGenerator(this);
    cmGlobalNinjaGenerator::AddPerConfigUtilityTarget(this_01,targetName);
    cmAlphaNum::cmAlphaNum(&local_200,(string *)local_50);
    view = (string_view)::cm::operator____s("$<CONFIG>",9);
    cmAlphaNum::cmAlphaNum(&local_230,view);
    cmStrCat<>(__return_storage_ptr__,&local_200,&local_230);
    std::__cxx11::string::~string((string *)local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalNinjaGenerator::CreateUtilityOutput(
  std::string const& targetName, std::vector<std::string> const& byproducts,
  cmListFileBacktrace const& bt)
{
  // In Ninja Multi-Config, we can only produce cross-config utility
  // commands if all byproducts are per-config.
  if (!this->GetGlobalGenerator()->IsMultiConfig() ||
      !this->HasUniqueByproducts(byproducts, bt)) {
    return this->cmLocalGenerator::CreateUtilityOutput(targetName, byproducts,
                                                       bt);
  }

  std::string const base = cmStrCat(this->GetCurrentBinaryDirectory(),
                                    "/CMakeFiles/", targetName, '-');
  // The output is not actually created so mark it symbolic.
  for (std::string const& config :
       this->Makefile->GetGeneratorConfigs(cmMakefile::IncludeEmptyConfig)) {
    std::string const force = cmStrCat(base, config);
    if (cmSourceFile* sf = this->Makefile->GetOrCreateGeneratedSource(force)) {
      sf->SetProperty("SYMBOLIC", "1");
    } else {
      cmSystemTools::Error("Could not get source file entry for " + force);
    }
  }
  this->GetGlobalNinjaGenerator()->AddPerConfigUtilityTarget(targetName);
  return cmStrCat(base, "$<CONFIG>"_s);
}